

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O1

void FAudio_PlatformInit(FAudio *audio,uint32_t flags,uint32_t deviceIndex,
                        FAudioWaveFormatExtensible *mixFormat,uint32_t *updateSize,
                        void **platformDevice)

{
  undefined2 uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  SDL_AudioSpec have;
  uint32_t local_88;
  undefined2 local_84;
  undefined1 local_82;
  undefined1 local_81;
  int local_80;
  code *local_78;
  FAudio *local_70;
  FAudioWaveFormatExtensible *local_68;
  uint *local_60;
  void **local_58;
  uint32_t local_50;
  byte local_4a;
  ushort local_48;
  
  local_88 = (mixFormat->Format).nSamplesPerSec;
  local_84 = 0x8120;
  local_82 = (undefined1)(mixFormat->Format).nChannels;
  local_81 = 0;
  local_78 = FAudio_INTERNAL_MixCallback;
  if ((short)flags < 0) {
    uVar1 = (undefined2)(int)((double)(int)local_88 / 46.875);
  }
  else {
    uVar1 = (undefined2)((int)local_88 / 100);
  }
  local_80 = CONCAT22(local_80._2_2_,uVar1);
  local_70 = audio;
  local_68 = mixFormat;
  local_60 = updateSize;
  local_58 = platformDevice;
  uVar4 = SDL_GetCurrentAudioDriver();
  iVar2 = SDL_strcmp(uVar4,"pulseaudio");
  if (iVar2 == 0) {
    local_80 = CONCAT22(local_80._2_2_,(short)local_80 << 1);
    uVar9 = 8;
  }
  else {
    iVar2 = SDL_strcmp(uVar4,"emscripten");
    if (iVar2 != 0) {
      iVar2 = SDL_strcmp(uVar4,"dsp");
      uVar9 = 0;
      if (iVar2 != 0) goto LAB_0011cc71;
    }
    uVar6 = local_80 - 1;
    uVar8 = (uVar6 & 0xffff) >> 1;
    uVar7 = (uVar8 | uVar6 & 0xffff) >> 2;
    uVar6 = (uVar7 | uVar8 | uVar6 & 0xffff) >> 4 | uVar7 | uVar8 | uVar6;
    local_80 = CONCAT22(local_80._2_2_,((ushort)(uVar6 >> 8) & 0xff | (ushort)uVar6) + 1);
    uVar9 = 0;
    SDL_Log(
           "Forcing FAudio quantum to a power-of-two.\nYou don\'t actually want this, it\'s technically a bug:\nhttps://bugzilla.libsdl.org/show_bug.cgi?id=5136"
           );
  }
LAB_0011cc71:
  while( true ) {
    if (deviceIndex == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = SDL_GetAudioDeviceName(deviceIndex - 1,0);
    }
    uVar6 = SDL_OpenAudioDevice(uVar4,0,&local_88,&local_50,uVar9);
    if (uVar6 != 0) break;
    uVar4 = SDL_GetError();
    SDL_Log("OpenAudioDevice failed: %s",uVar4);
    lVar5 = SDL_strstr();
    if (lVar5 == 0) {
      return;
    }
  }
  (local_68->Format).wBitsPerSample = 0x20;
  (local_68->Format).cbSize = 0x16;
  (local_68->Format).wFormatTag = 0xfffe;
  (local_68->Format).nChannels = (ushort)local_4a;
  (local_68->Format).nSamplesPerSec = local_50;
  iVar2 = (uint)(ushort)local_4a * 4;
  (local_68->Format).nBlockAlign = (uint16_t)iVar2;
  (local_68->Format).nAvgBytesPerSec = iVar2 * local_50;
  (local_68->Samples).wValidBitsPerSample = 0x20;
  uVar3 = 0;
  if ((byte)(local_4a - 1) < 8) {
    uVar3 = *(uint32_t *)(&DAT_0012682c + (ulong)(byte)(local_4a - 1) * 4);
  }
  local_68->dwChannelMask = uVar3;
  SDL_memcpy(&local_68->SubFormat,&DATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
  *local_60 = (uint)local_48;
  *local_58 = (void *)(ulong)uVar6;
  SDL_PauseAudioDevice(uVar6,0);
  return;
}

Assistant:

void FAudio_PlatformInit(
	FAudio *audio,
	uint32_t flags,
	uint32_t deviceIndex,
	FAudioWaveFormatExtensible *mixFormat,
	uint32_t *updateSize,
	void** platformDevice
) {
	SDL_AudioDeviceID device;
	SDL_AudioSpec want, have;
	const char *driver;
	int changes = 0;

	FAudio_assert(mixFormat != NULL);
	FAudio_assert(updateSize != NULL);

	/* Build the device spec */
	want.freq = mixFormat->Format.nSamplesPerSec;
	want.format = AUDIO_F32;
	want.channels = mixFormat->Format.nChannels;
	want.silence = 0;
	want.callback = FAudio_INTERNAL_MixCallback;
	want.userdata = audio;
	if (flags & FAUDIO_1024_QUANTUM)
	{
		/* Get the sample count for a 21.33ms frame.
		 * For 48KHz this should be 1024.
		 */
		want.samples = (int) (
			want.freq / (1000.0 / (64.0 / 3.0))
		);
	}
	else
	{
		want.samples = want.freq / 100;
	}

	/* FIXME: SDL bug!
	 * The PulseAudio backend does this annoying thing where it halves the
	 * buffer size to prevent latency issues:
	 *
	 * https://hg.libsdl.org/SDL/file/df343364c6c5/src/audio/pulseaudio/SDL_pulseaudio.c#l577
	 *
	 * To get the _actual_ quantum size we want, we just double the buffer
	 * size and allow SDL to set the quantum size back to normal.
	 * -flibit
	 */
	driver = SDL_GetCurrentAudioDriver();
	if (SDL_strcmp(driver, "pulseaudio") == 0)
	{
		want.samples *= 2;
		changes = SDL_AUDIO_ALLOW_SAMPLES_CHANGE;
	}

	/* FIXME: SDL bug!
	 * The most common backends support varying samples values, but many
	 * require a power-of-two value, which XAudio2 is not a fan of.
	 * Normally SDL creates an intermediary stream to handle this, but this
	 * has not been written yet:
	 * https://bugzilla.libsdl.org/show_bug.cgi?id=5136
	 * -flibit
	 */
	else if (	SDL_strcmp(driver, "emscripten") == 0 ||
			SDL_strcmp(driver, "dsp") == 0	)
	{
		want.samples -= 1;
		want.samples |= want.samples >> 1;
		want.samples |= want.samples >> 2;
		want.samples |= want.samples >> 4;
		want.samples |= want.samples >> 8;
		want.samples |= want.samples >> 16;
		want.samples += 1;
		SDL_Log(
			"Forcing FAudio quantum to a power-of-two.\n"
			"You don't actually want this, it's technically a bug:\n"
			"https://bugzilla.libsdl.org/show_bug.cgi?id=5136"
		);
	}

	/* Open the device (or at least try to) */
iosretry:
	device = SDL_OpenAudioDevice(
		deviceIndex > 0 ? SDL_GetAudioDeviceName(deviceIndex - 1, 0) : NULL,
		0,
		&want,
		&have,
		changes
	);
	if (device == 0)
	{
		const char *err = SDL_GetError();
		SDL_Log("OpenAudioDevice failed: %s", err);

		/* iOS has a weird thing where you can't open a stream when the
		 * app is in the background, even though the program is meant
		 * to be suspended and thus not trip this in the first place.
		 *
		 * Startup suspend behavior when an app is opened then closed
		 * is a big pile of crap, basically.
		 *
		 * Google the error code and you'll find that this has been a
		 * long-standing issue that nobody seems to care about.
		 * -flibit
		 */
		if (SDL_strstr(err, "Code=561015905") != NULL)
		{
			goto iosretry;
		}

		FAudio_assert(0 && "Failed to open audio device!");
		return;
	}

	/* Write up the received format for the engine */
	WriteWaveFormatExtensible(
		mixFormat,
		have.channels,
		have.freq,
		&DATAFORMAT_SUBTYPE_IEEE_FLOAT
	);
	*updateSize = have.samples;

	/* SDL_AudioDeviceID is a Uint32, anybody using a 16-bit PC still? */
	*platformDevice = (void*) ((size_t) device);

	/* Start the thread! */
	SDL_PauseAudioDevice(device, 0);
}